

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::ValidatedSnapshotCleanup(ChainstateManager *this)

{
  bool bVar1;
  path *ppVar2;
  path *ppVar3;
  size_type sVar4;
  long in_FS_OFFSET;
  filesystem_error *e_1;
  filesystem_error *e;
  path *ibd_chainstate_path;
  path *snapshot_chainstate_path;
  anon_class_8_1_8991fb9c rename_failed_abort;
  anon_class_1_0_00000001 get_storage_path;
  path tmp_old;
  optional<fs::path> snapshot_chainstate_path_maybe;
  optional<fs::path> ibd_chainstate_path_maybe;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar5;
  int in_stack_fffffffffffffc6c;
  path *in_stack_fffffffffffffc70;
  ChainstateManager *in_stack_fffffffffffffc78;
  char *pcVar6;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc88;
  ChainstateManager *in_stack_fffffffffffffcb8;
  LogFlags in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  int iVar9;
  char *pcVar7;
  path *ppVar8;
  undefined8 in_stack_fffffffffffffcf0;
  undefined1 is_snapshot;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  bool local_2e9;
  ConstevalFormatString<0U> in_stack_fffffffffffffd18;
  string_view in_stack_fffffffffffffd20;
  string_view in_stack_fffffffffffffd30;
  Level in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  char local_168 [184];
  path local_b0;
  char local_88 [128];
  long local_8;
  
  is_snapshot = (undefined1)((ulong)in_stack_fffffffffffffcf0 >> 0x38);
  iVar9 = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc6c,(AnnotatedMixin<std::recursive_mutex> *)0x7f36b0);
  ValidatedSnapshotCleanup()::$_0::operator()
            (in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->m_ibd_chainstate);
  ValidatedSnapshotCleanup()::$_0::operator()
            (in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->m_ibd_chainstate);
  bVar1 = IsSnapshotValidated(in_stack_fffffffffffffc78);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<fs::path> *)
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if ((bVar1) &&
       (bVar1 = std::optional::operator_cast_to_bool
                          ((optional<fs::path> *)
                           CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)), bVar1)) {
      ppVar2 = (path *)std::optional<fs::path>::operator*
                                 ((optional<fs::path> *)
                                  CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      ppVar3 = (path *)std::optional<fs::path>::operator*
                                 ((optional<fs::path> *)
                                  CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      ResetChainstates(in_stack_fffffffffffffc78);
      GetAll(in_stack_fffffffffffffcb8);
      sVar4 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                        ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      if (sVar4 != 0) {
        __assert_fail("this->GetAll().size() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x191b,"bool ChainstateManager::ValidatedSnapshotCleanup()");
      }
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffc78);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      pcVar7 = "[snapshot] deleting background chainstate directory (now unnecessary) (%s)\n";
      fs::PathToString_abi_cxx11_(in_stack_fffffffffffffc70);
      pcVar6 = local_88;
      uVar5 = 2;
      ppVar8 = (path *)pcVar7;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd20,(int)((ulong)pcVar7 >> 0x20),
                 in_stack_fffffffffffffcd0,in_stack_fffffffffffffe10,
                 (ConstevalFormatString<1U>)in_stack_fffffffffffffd18.fmt,in_stack_fffffffffffffe20)
      ;
      iVar9 = (int)((ulong)ppVar8 >> 0x20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,uVar5));
      fs::path::path((path *)CONCAT44(in_stack_fffffffffffffc6c,uVar5),(path *)0x7f395f);
      fs::operator+((path *)in_stack_fffffffffffffc80,pcVar6);
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffc6c,uVar5));
      std::filesystem::rename(ppVar3,&local_b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      fs::PathToString_abi_cxx11_((path *)pcVar7);
      fs::PathToString_abi_cxx11_((path *)pcVar7);
      pcVar6 = local_168;
      pcVar7 = "[snapshot] moving snapshot chainstate (%s) to default chainstate directory (%s)\n";
      uVar5 = 2;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd20,iVar9,in_stack_fffffffffffffcd0
                 ,in_stack_fffffffffffffe10,(ConstevalFormatString<2U>)in_stack_fffffffffffffd18.fmt
                 ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,uVar5));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,uVar5));
      std::filesystem::rename(ppVar2,ppVar3);
      fs::path::path((path *)CONCAT44(in_stack_fffffffffffffc6c,uVar5),(path *)0x7f3df3);
      bVar1 = DeleteCoinsDBFromDisk
                        ((path *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                         (bool)is_snapshot);
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffc6c,uVar5));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffc88,pcVar6);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffc88,pcVar6);
        fs::PathToString_abi_cxx11_((path *)pcVar7);
        in_stack_fffffffffffffc68 = 2;
        LogPrintFormatInternal<std::__cxx11::string>
                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd20,iVar9,
                   in_stack_fffffffffffffcd0,in_stack_fffffffffffffe10,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffd18.fmt,
                   in_stack_fffffffffffffe20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffc88,pcVar6);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffc88,pcVar6);
        fs::PathToString_abi_cxx11_((path *)pcVar7);
        in_stack_fffffffffffffc68 = 2;
        LogPrintFormatInternal<std::__cxx11::string>
                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd20,iVar9,
                   in_stack_fffffffffffffcd0,in_stack_fffffffffffffe10,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffd18.fmt,
                   in_stack_fffffffffffffe20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      }
      local_2e9 = true;
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
      in_stack_fffffffffffffc68 = 2;
      LogPrintFormatInternal<>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd20,iVar9,in_stack_fffffffffffffcd0
                 ,in_stack_fffffffffffffe10,in_stack_fffffffffffffd18);
      local_2e9 = false;
    }
  }
  else {
    local_2e9 = false;
  }
  std::optional<fs::path>::~optional
            ((optional<fs::path> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::optional<fs::path>::~optional
            ((optional<fs::path> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2e9;
}

Assistant:

bool ChainstateManager::ValidatedSnapshotCleanup()
{
    AssertLockHeld(::cs_main);
    auto get_storage_path = [](auto& chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) -> std::optional<fs::path> {
        if (!(chainstate && chainstate->HasCoinsViews())) {
            return {};
        }
        return chainstate->CoinsDB().StoragePath();
    };
    std::optional<fs::path> ibd_chainstate_path_maybe = get_storage_path(m_ibd_chainstate);
    std::optional<fs::path> snapshot_chainstate_path_maybe = get_storage_path(m_snapshot_chainstate);

    if (!this->IsSnapshotValidated()) {
        // No need to clean up.
        return false;
    }
    // If either path doesn't exist, that means at least one of the chainstates
    // is in-memory, in which case we can't do on-disk cleanup. You'd better be
    // in a unittest!
    if (!ibd_chainstate_path_maybe || !snapshot_chainstate_path_maybe) {
        LogPrintf("[snapshot] snapshot chainstate cleanup cannot happen with "
                  "in-memory chainstates. You are testing, right?\n");
        return false;
    }

    const auto& snapshot_chainstate_path = *snapshot_chainstate_path_maybe;
    const auto& ibd_chainstate_path = *ibd_chainstate_path_maybe;

    // Since we're going to be moving around the underlying leveldb filesystem content
    // for each chainstate, make sure that the chainstates (and their constituent
    // CoinsViews members) have been destructed first.
    //
    // The caller of this method will be responsible for reinitializing chainstates
    // if they want to continue operation.
    this->ResetChainstates();

    // No chainstates should be considered usable.
    assert(this->GetAll().size() == 0);

    LogPrintf("[snapshot] deleting background chainstate directory (now unnecessary) (%s)\n",
              fs::PathToString(ibd_chainstate_path));

    fs::path tmp_old{ibd_chainstate_path + "_todelete"};

    auto rename_failed_abort = [this](
                                   fs::path p_old,
                                   fs::path p_new,
                                   const fs::filesystem_error& err) {
        LogError("[snapshot] Error renaming path (%s) -> (%s): %s\n",
                  fs::PathToString(p_old), fs::PathToString(p_new), err.what());
        GetNotifications().fatalError(strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "Cannot clean up the background chainstate leveldb directory."),
            fs::PathToString(p_old), fs::PathToString(p_new)));
    };

    try {
        fs::rename(ibd_chainstate_path, tmp_old);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(ibd_chainstate_path, tmp_old, e);
        throw;
    }

    LogPrintf("[snapshot] moving snapshot chainstate (%s) to "
              "default chainstate directory (%s)\n",
              fs::PathToString(snapshot_chainstate_path), fs::PathToString(ibd_chainstate_path));

    try {
        fs::rename(snapshot_chainstate_path, ibd_chainstate_path);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(snapshot_chainstate_path, ibd_chainstate_path, e);
        throw;
    }

    if (!DeleteCoinsDBFromDisk(tmp_old, /*is_snapshot=*/false)) {
        // No need to FatalError because once the unneeded bg chainstate data is
        // moved, it will not interfere with subsequent initialization.
        LogPrintf("Deletion of %s failed. Please remove it manually, as the "
                  "directory is now unnecessary.\n",
                  fs::PathToString(tmp_old));
    } else {
        LogPrintf("[snapshot] deleted background chainstate directory (%s)\n",
                  fs::PathToString(ibd_chainstate_path));
    }
    return true;
}